

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::doAtomicStore
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Address addr,Index bytes,Literal *toStore,
          Name memoryName,Address memorySize)

{
  ExternalInterface *pEVar1;
  address64_t aVar2;
  Literal local_148;
  char *local_130;
  undefined1 local_128 [8];
  Store store;
  Const value;
  Literal local_90;
  undefined1 local_78 [8];
  Const ptr;
  Literal *toStore_local;
  Index bytes_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Address memorySize_local;
  Name memoryName_local;
  Address addr_local;
  
  memoryName_local.super_IString.str._M_len = memoryName.super_IString.str._M_str;
  memorySize_local.addr = memoryName.super_IString.str._M_len;
  ptr.value.type.id = memorySize.addr;
  memoryName_local.super_IString.str._M_str = (char *)addr.addr;
  checkAtomicAddress(this,addr,bytes,memorySize);
  Const::Const((Const *)local_78);
  aVar2 = Address::operator_cast_to_unsigned_long
                    ((Address *)&memoryName_local.super_IString.str._M_str);
  wasm::Literal::Literal(&local_90,(int32_t)aVar2);
  ::wasm::Literal::operator=
            ((Literal *)
             &ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,&local_90
            );
  ::wasm::Literal::~Literal(&local_90);
  Type::Type(&value.value.type,i32);
  ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_ =
       value.value.type.id;
  Const::Const((Const *)&store.memory.super_IString.str._M_str);
  ::wasm::Literal::operator=
            ((Literal *)
             &value.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,toStore
            );
  value.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_ =
       (toStore->type).id;
  Store::Store((Store *)local_128);
  toStore_local._4_1_ = (undefined1)bytes;
  store.super_SpecificExpression<(wasm::Expression::Id)13>.super_Expression.type.id._0_1_ =
       toStore_local._4_1_;
  Address::operator=(&store.offset,(ulong)bytes);
  store.align.addr._0_1_ = 1;
  store._40_8_ = local_78;
  store.ptr = (Expression *)&store.memory.super_IString.str._M_str;
  store.value = (Expression *)
                value.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_;
  Name::operator=((Name *)&store.valueType,(Name *)&memorySize_local);
  pEVar1 = this->externalInterface;
  local_130 = memoryName_local.super_IString.str._M_str;
  ::wasm::Literal::Literal(&local_148,toStore);
  (*pEVar1->_vptr_ExternalInterface[0xc])
            (pEVar1,local_128,local_130,&local_148,memorySize_local.addr,
             memoryName_local.super_IString.str._M_len);
  ::wasm::Literal::~Literal(&local_148);
  Const::~Const((Const *)&store.memory.super_IString.str._M_str);
  Const::~Const((Const *)local_78);
  return;
}

Assistant:

void doAtomicStore(Address addr,
                     Index bytes,
                     Literal toStore,
                     Name memoryName,
                     Address memorySize) {
    checkAtomicAddress(addr, bytes, memorySize);
    Const ptr;
    ptr.value = Literal(int32_t(addr));
    ptr.type = Type::i32;
    Const value;
    value.value = toStore;
    value.type = toStore.type;
    Store store;
    store.bytes = bytes;
    store.align = bytes;
    store.isAtomic = true; // understatement
    store.ptr = &ptr;
    store.value = &value;
    store.valueType = value.type;
    store.memory = memoryName;
    return externalInterface->store(&store, addr, toStore, memoryName);
  }